

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O0

void cmDisplayStatus(void *arg,char *message)

{
  allocator<char> local_41;
  string local_40;
  void *local_20;
  cmMakefile *mf;
  char *message_local;
  void *arg_local;
  
  local_20 = arg;
  mf = (cmMakefile *)message;
  message_local = (char *)arg;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,message,&local_41);
  cmMakefile::DisplayStatus((cmMakefile *)arg,&local_40,-1.0);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  return;
}

Assistant:

static void CCONV cmDisplayStatus(void* arg, const char* message)
{
  cmMakefile* mf = static_cast<cmMakefile*>(arg);
  mf->DisplayStatus(message, -1);
}